

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.c
# Opt level: O1

void attoAppInit(AAppProctable *proctable)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  
  aAppDebugPrintf("%s[%u]: argc = %d, argv = %p","attoAppInit",0,(ulong)(uint)a_app_state->argc,
                  a_app_state->argv);
  if (0 < a_app_state->argc) {
    uVar3 = 0;
    do {
      aAppDebugPrintf("\targv[%d] = \'%s\'",uVar3 & 0xffffffff,a_app_state->argv[uVar3]);
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < (long)a_app_state->argc);
  }
  pcVar1 = "Unknown";
  if (a_app_state->gl_version == AOGLV_ES_20) {
    pcVar1 = "ES 2.0";
  }
  pcVar2 = "OpenGL 2.1 or later";
  if (a_app_state->gl_version != AOGLV_21) {
    pcVar2 = pcVar1;
  }
  aAppDebugPrintf("\tOpenGL version %s",pcVar2);
  proctable->resize = appResize;
  proctable->paint = appPaint;
  proctable->key = appKeyPress;
  proctable->pointer = appPointer;
  proctable->close = appClose;
  return;
}

Assistant:

void attoAppInit(struct AAppProctable *proctable) {
	int i;
	aAppDebugPrintf("%s[%u]: argc = %d, argv = %p", __func__, 0, a_app_state->argc, (void *)a_app_state->argv);
	for (i = 0; i < a_app_state->argc; ++i) aAppDebugPrintf("\targv[%d] = '%s'", i, a_app_state->argv[i]);
	aAppDebugPrintf("\tOpenGL version %s", opengl_version(a_app_state->gl_version));

	proctable->resize = appResize;
	proctable->paint = appPaint;
	proctable->key = appKeyPress;
	proctable->pointer = appPointer;
	proctable->close = appClose;
}